

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O1

void http1_destroy(fio_protocol_s *pr)

{
  pr[3].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  fiobj_free((FIOBJ)pr[3].on_data);
  fiobj_free((FIOBJ)pr[3].on_ready);
  fiobj_free((FIOBJ)pr[2].on_close);
  fiobj_free((FIOBJ)pr[4].on_data);
  fiobj_free((FIOBJ)pr[3].on_shutdown);
  fiobj_free(pr[3].rsv);
  fiobj_free((FIOBJ)pr[3].ping);
  fiobj_free((FIOBJ)pr[4].on_ready);
  fiobj_free((FIOBJ)pr[4].on_close);
  fiobj_free((FIOBJ)pr[4].on_shutdown);
  pr[4].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr[4].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr[4].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr[4].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
  pr[3].rsv = 0;
  pr[4].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr[3].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr[3].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr[3].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr[3].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
  pr[2].rsv = 0;
  pr[3].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr[2].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  pr[2].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  fio_free(pr);
  return;
}

Assistant:

void http1_destroy(fio_protocol_s *pr) {
  http1pr_s *p = (http1pr_s *)pr;
  http1_pr2handle(p).status = 0;
  http_s_destroy(&http1_pr2handle(p), 0);
  fio_free(p);
  // FIO_LOG_DEBUG("Deallocated HTTP/1.1 protocol at. %p", (void *)p);
}